

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O0

Error asmjit::v1_14::arm::FormatterInternal::formatRegisterList
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rMask)

{
  int iVar1;
  bool bVar2;
  ModifyOp op;
  Error EVar3;
  BaseEmitter *in_RDI;
  ModifyOp in_R9D;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  uint32_t mask;
  uint32_t count;
  uint32_t start;
  Error _err;
  bool first;
  uint32_t in_stack_00000170;
  uint32_t in_stack_00000178;
  undefined4 in_stack_ffffffffffffff40;
  ModifyOp in_stack_ffffffffffffff44;
  String *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Error in_stack_ffffffffffffff58;
  Error in_stack_ffffffffffffff5c;
  uint uVar4;
  ModifyOp local_88;
  Error local_64;
  char *in_stack_ffffffffffffffa8;
  BaseEmitter *in_stack_ffffffffffffffb0;
  FormatFlags in_stack_ffffffffffffffbc;
  String *in_stack_ffffffffffffffc0;
  ModifyOp local_18;
  ModifyOp local_14;
  ModifyOp *local_10;
  ModifyOp *local_8;
  
  bVar2 = true;
  local_64 = String::_opChar(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                             (char)((uint)in_stack_ffffffffffffff40 >> 0x18));
  local_88 = in_R9D;
  if (local_64 == 0) {
    while (local_88 != kAssign) {
      local_14 = local_88;
      local_8 = &local_14;
      local_18 = local_88;
      local_10 = &local_18;
      iVar1 = 0;
      if (local_88 != kAssign) {
        for (; (local_88 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
        }
      }
      uVar4 = 0;
      op = 1 << ((byte)iVar1 & 0x1f);
      do {
        local_88 = (op ^ ~kAssign) & local_88;
        op = op << 1;
        uVar4 = uVar4 + 1;
      } while ((local_88 & op) != kAssign);
      if (!bVar2) {
        in_stack_ffffffffffffffa8 = ", ";
        in_stack_ffffffffffffffb0 = in_RDI;
        EVar3 = String::_opString((String *)CONCAT44(iVar1,uVar4),op,
                                  (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      in_stack_ffffffffffffff40 = 0xffffffff;
      in_stack_ffffffffffffff5c =
           formatRegister(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb0,(Arch)((ulong)in_stack_ffffffffffffffa8 >> 0x38)
                          ,(RegType)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
                          (uint32_t)in_stack_ffffffffffffffa8,in_stack_00000170,in_stack_00000178);
      if (in_stack_ffffffffffffff5c != 0) {
        return in_stack_ffffffffffffff5c;
      }
      if (1 < uVar4) {
        in_stack_ffffffffffffff58 =
             String::_opChar(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                             (char)((uint)in_stack_ffffffffffffff40 >> 0x18));
        if (in_stack_ffffffffffffff58 != 0) {
          return in_stack_ffffffffffffff58;
        }
        in_stack_ffffffffffffff40 = 0xffffffff;
        EVar3 = formatRegister(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                               in_stack_ffffffffffffffb0,
                               (Arch)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                               (RegType)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
                               (uint32_t)in_stack_ffffffffffffffa8,in_stack_00000170,
                               in_stack_00000178);
        if (EVar3 != 0) {
          return EVar3;
        }
        in_stack_ffffffffffffff54 = 0;
      }
      bVar2 = false;
    }
    local_64 = String::_opChar(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                               (char)((uint)in_stack_ffffffffffffff40 >> 0x18));
    if (local_64 == 0) {
      local_64 = 0;
    }
  }
  return local_64;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegisterList(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rMask) noexcept {

  bool first = true;

  ASMJIT_PROPAGATE(sb.append('{'));
  while (rMask != 0u) {
    uint32_t start = Support::ctz(rMask);
    uint32_t count = 0u;

    uint32_t mask = 1u << start;
    do {
      rMask &= ~mask;
      mask <<= 1u;
      count++;
    } while (rMask & mask);

    if (!first)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start, 0, 0xFFFFFFFFu));
    if (count >= 2u) {
      ASMJIT_PROPAGATE(sb.append('-'));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start + count - 1, 0, 0xFFFFFFFFu));
    }

    first = false;
  }
  ASMJIT_PROPAGATE(sb.append('}'));

  return kErrorOk;
}